

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O1

void api_suite::api_index_operator(void)

{
  mapped_type *pmVar1;
  key_type local_70 [2];
  map_array<int,_int,_4UL,_std::less<int>_> local_68;
  
  local_68.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.
  member.tail = (pointer)&local_68.super_map_view<int,_int,_4UL,_std::less<int>_>;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[1].first = 0;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[1].second = 0;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].first = 0;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].second = 0;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[3].first = 0;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[3].second = 0;
  local_68.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.
  member.head = (pointer)&local_68;
  local_68.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail =
       local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems + 1;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[0].first = 0xb;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[0].second = 1;
  local_70[0] = 0xb;
  pmVar1 = vista::map_array<int,_int,_4UL,_std::less<int>_>::operator[](&local_68,local_70);
  local_70[1] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("array[11]","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x96,"void api_suite::api_index_operator()",pmVar1,local_70 + 1);
  local_70[0] = 0xc;
  pmVar1 = vista::map_array<int,_int,_4UL,_std::less<int>_>::operator[](&local_68,local_70);
  local_70[1] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("array[12]","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x97,"void api_suite::api_index_operator()",pmVar1,local_70 + 1);
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}